

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O3

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  ushort uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  HuffmanCode HVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  HuffmanCode *pHVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int offset [16];
  int local_104;
  long local_c8;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int aiStack_78 [18];
  
  bVar10 = (byte)root_bits;
  iVar7 = 1 << (bVar10 & 0x1f);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_b8._0_4_ = 0;
  if (0 < code_lengths_size) {
    uVar14 = 0;
    do {
      if (0xf < (long)code_lengths[uVar14]) {
        return 0;
      }
      *(int *)(local_b8 + (long)code_lengths[uVar14] * 4) =
           *(int *)(local_b8 + (long)code_lengths[uVar14] * 4) + 1;
      uVar14 = uVar14 + 1;
    } while ((uint)code_lengths_size != uVar14);
  }
  if (local_b8._0_4_ == code_lengths_size) {
    return 0;
  }
  aiStack_78[1] = 0;
  lVar29 = 0;
  do {
    if (1 << ((char)lVar29 + 1U & 0x1f) < *(int *)(local_b8 + lVar29 * 4 + 4)) {
      return 0;
    }
    aiStack_78[lVar29 + 2] = *(int *)(local_b8 + lVar29 * 4 + 4) + aiStack_78[lVar29 + 1];
    lVar29 = lVar29 + 1;
  } while (lVar29 != 0xe);
  if (0 < code_lengths_size) {
    uVar14 = 0;
    do {
      lVar29 = (long)code_lengths[uVar14];
      if (0 < lVar29) {
        iVar30 = aiStack_78[lVar29];
        if (sorted == (uint16_t *)0x0) {
          aiStack_78[lVar29] = iVar30 + 1;
        }
        else {
          if (code_lengths_size <= iVar30) {
            return 0;
          }
          aiStack_78[lVar29] = iVar30 + 1;
          sorted[iVar30] = (uint16_t)uVar14;
        }
      }
      uVar14 = uVar14 + 1;
    } while ((uint)code_lengths_size != uVar14);
  }
  iVar30 = aiStack_78[0xf];
  auVar5 = _DAT_0012b610;
  auVar4 = _DAT_0012b600;
  auVar3 = _DAT_001294b0;
  if (aiStack_78[0xf] == 1) {
    if (sorted != (uint16_t *)0x0) {
      HVar8 = (HuffmanCode)((uint)*sorted << 0x10);
      lVar17 = (long)iVar7;
      lVar29 = 1;
      if (1 < lVar17) {
        lVar29 = lVar17;
      }
      lVar27 = lVar29 + -1;
      auVar36._8_4_ = (int)lVar27;
      auVar36._0_8_ = lVar27;
      auVar36._12_4_ = (int)((ulong)lVar27 >> 0x20);
      pHVar18 = root_table + lVar17 + -1;
      uVar14 = 0;
      auVar36 = auVar36 ^ _DAT_0012b610;
      do {
        auVar37._8_4_ = (int)uVar14;
        auVar37._0_8_ = uVar14;
        auVar37._12_4_ = (int)(uVar14 >> 0x20);
        auVar38 = (auVar37 | auVar3) ^ auVar5;
        iVar30 = auVar36._4_4_;
        if ((bool)(~(auVar38._4_4_ == iVar30 && auVar36._0_4_ < auVar38._0_4_ ||
                    iVar30 < auVar38._4_4_) & 1)) {
          *pHVar18 = HVar8;
        }
        if ((auVar38._12_4_ != auVar36._12_4_ || auVar38._8_4_ <= auVar36._8_4_) &&
            auVar38._12_4_ <= auVar36._12_4_) {
          pHVar18[-1] = HVar8;
        }
        auVar37 = (auVar37 | auVar4) ^ auVar5;
        iVar19 = auVar37._4_4_;
        if (iVar19 <= iVar30 && (iVar19 != iVar30 || auVar37._0_4_ <= auVar36._0_4_)) {
          pHVar18[-2] = HVar8;
          pHVar18[-3] = HVar8;
        }
        uVar14 = uVar14 + 4;
        pHVar18 = pHVar18 + -4;
      } while (((int)lVar29 + 3U & 0xfffffffc) != uVar14);
      return iVar7;
    }
    return iVar7;
  }
  iVar19 = 1;
  if (root_bits < 1) {
    uVar33 = 0;
    iVar24 = 1;
    uVar14 = 0;
  }
  else {
    iVar28 = 2;
    uVar35 = 1;
    uVar33 = 0;
    iVar24 = 1;
    uVar14 = 0;
    iVar21 = 1;
    do {
      iVar9 = *(int *)(local_b8 + uVar35 * 4);
      iVar19 = iVar21 * 2 - iVar9;
      if (iVar19 < 0) {
        return 0;
      }
      if (0 < iVar9 && root_table != (HuffmanCode *)0x0) {
        uVar33 = (ulong)(int)uVar33;
        do {
          uVar1 = sorted[uVar33];
          iVar15 = iVar7;
          do {
            iVar23 = iVar15 - iVar28;
            iVar15 = iVar15 - iVar28;
            root_table[uVar14 + (long)iVar23] =
                 (HuffmanCode)((uint)uVar1 << 0x10 | (uint)uVar35 & 0xff);
            uVar32 = 1 << ((char)uVar35 - 1U & 0x1f);
          } while (0 < iVar15);
          do {
            uVar16 = uVar32;
            uVar32 = uVar16 >> 1;
          } while ((uVar16 & (uint)uVar14) != 0);
          uVar33 = uVar33 + 1;
          uVar14 = (ulong)(((uint)uVar14 & uVar16 - 1) + uVar16);
          bVar2 = 1 < iVar9;
          iVar9 = iVar9 + -1;
        } while (bVar2);
        *(undefined4 *)(local_b8 + uVar35 * 4) = 0;
      }
      iVar24 = iVar24 + iVar21 * 2;
      uVar35 = uVar35 + 1;
      iVar28 = iVar28 * 2;
      iVar21 = iVar19;
    } while (uVar35 != root_bits + 1);
    if (0xe < root_bits) goto LAB_00126f32;
  }
  uVar16 = iVar7 - 1;
  local_104 = root_bits + 1;
  local_c8 = (long)root_bits + 2;
  uVar32 = 0xffffffff;
  iVar28 = 2;
  lVar29 = (long)root_bits;
  pHVar18 = root_table;
  iVar21 = iVar7;
  do {
    iVar9 = iVar19 * 2 - *(int *)(local_b8 + lVar29 * 4 + 4);
    if (iVar9 < 0) {
      return 0;
    }
    lVar17 = lVar29 + 1;
    if (*(int *)(local_b8 + lVar29 * 4 + 4) < 1) {
      uVar20 = (uint)uVar14;
    }
    else {
      uVar25 = (int)lVar17 - root_bits;
      bVar11 = (byte)uVar25;
      iVar30 = 1 << (bVar11 & 0x1f);
      uVar34 = 1 << ((byte)lVar29 & 0x1f);
      do {
        uVar22 = (uint)uVar14;
        uVar20 = uVar22 & uVar16;
        if (uVar20 == uVar32) {
          uVar20 = uVar32;
          uVar6 = uVar34;
          iVar15 = iVar21;
          if (root_table != (HuffmanCode *)0x0) {
LAB_00126e8f:
            uVar1 = sorted[(int)uVar33];
            iVar21 = iVar15;
            do {
              iVar23 = iVar21 - iVar28;
              iVar21 = iVar21 - iVar28;
              pHVar18[(ulong)(uVar22 >> (bVar10 & 0x1f)) + (long)iVar23] =
                   (HuffmanCode)((uint)uVar1 * 0x10000 + (uVar25 & 0xff));
            } while (0 < iVar21);
            uVar33 = (ulong)((int)uVar33 + 1);
            uVar6 = uVar34;
            uVar32 = uVar20;
          }
        }
        else {
          lVar27 = local_c8;
          iVar15 = iVar30;
          iVar23 = local_104;
          bVar13 = bVar11;
          if (lVar29 != 0xe) {
            do {
              cVar12 = (char)iVar23;
              iVar26 = iVar15 - (&iStack_bc)[lVar27];
              if (iVar26 == 0 || iVar15 < (&iStack_bc)[lVar27]) goto LAB_00126e4b;
              iVar31 = (int)lVar27;
              lVar27 = lVar27 + 1;
              iVar23 = iVar23 + 1;
              iVar15 = iVar26 * 2;
            } while (iVar31 != 0xf);
            cVar12 = '\x0f';
LAB_00126e4b:
            bVar13 = cVar12 - bVar10;
            iVar15 = 1 << (bVar13 & 0x1f);
          }
          iVar7 = iVar7 + iVar15;
          uVar6 = uVar34;
          uVar32 = uVar20;
          if (root_table != (HuffmanCode *)0x0) {
            pHVar18 = pHVar18 + iVar21;
            root_table[uVar20].bits = bVar13 + bVar10;
            root_table[uVar20].value =
                 (short)((uint)((int)pHVar18 - (int)root_table) >> 2) - (short)uVar20;
            goto LAB_00126e8f;
          }
        }
        do {
          iVar21 = iVar15;
          uVar20 = uVar6;
          uVar6 = uVar20 >> 1;
          iVar15 = iVar21;
        } while ((uVar20 & uVar22) != 0);
        uVar20 = (uVar20 - 1 & uVar22) + uVar20;
        iVar15 = *(int *)(local_b8 + lVar17 * 4);
        *(int *)(local_b8 + lVar17 * 4) = iVar15 + -1;
        uVar14 = (ulong)uVar20;
      } while (1 < iVar15);
    }
    iVar24 = iVar24 + iVar19 * 2;
    iVar28 = iVar28 * 2;
    local_104 = local_104 + 1;
    local_c8 = local_c8 + 1;
    uVar14 = (ulong)uVar20;
    lVar29 = lVar17;
    iVar30 = aiStack_78[0xf];
    iVar19 = iVar9;
  } while (lVar17 != 0xf);
LAB_00126f32:
  iVar19 = 0;
  if (iVar24 == iVar30 * 2 + -1) {
    iVar19 = iVar7;
  }
  return iVar19;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        if(offset[symbol_code_length] >= code_lengths_size) {
            return 0;
        }
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = 0xffffffffu;        // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          if (root_table != NULL) table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          if (root_table != NULL) {
            root_table[low].bits = (uint8_t)(table_bits + root_bits);
            root_table[low].value = (uint16_t)((table - root_table) - low);
          }
        }
        if (root_table != NULL) {
          code.bits = (uint8_t)(len - root_bits);
          code.value = (uint16_t)sorted[symbol++];
          ReplicateValue(&table[key >> root_bits], step, table_size, code);
        }
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}